

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O0

unsigned_long __thiscall
dlib::thread_pool_implementation::num_threads_in_pool(thread_pool_implementation *this)

{
  size_t sVar1;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_RDI;
  auto_mutex M;
  mutex *in_stack_ffffffffffffffb8;
  
  auto_mutex::auto_mutex((auto_mutex *)in_RDI,in_stack_ffffffffffffffb8);
  sVar1 = array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
          ::size(in_RDI);
  auto_mutex::~auto_mutex((auto_mutex *)0x29c94c);
  return sVar1;
}

Assistant:

unsigned long thread_pool_implementation::
    num_threads_in_pool (
    ) const
    {
        auto_mutex M(m);
        return tasks.size();
    }